

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_readwrite(connectdata *conn,SessionHandle *data,_Bool *done)

{
  ulong uVar1;
  int *piVar2;
  long *plVar3;
  char **ppcVar4;
  _func_CURLcode_SessionHandle_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *p_Var5;
  void *pvVar6;
  curl_off_t *pcVar7;
  curl_off_t cVar8;
  _Bool _Var9;
  CURLcode CVar10;
  CHUNKcode code;
  CURLcode extraout_EAX;
  int iVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  char *pcVar15;
  char cVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  curl_socket_t readfd0;
  ulong unaff_R12;
  uint uVar23;
  long lVar24;
  bool bVar25;
  timeval tVar26;
  _Bool readmore;
  CURLcode local_54;
  ssize_t bytes_written;
  uint local_48;
  _Bool local_41;
  _Bool *local_40;
  long local_38;
  
  uVar21 = conn->cselect_bits;
  conn->cselect_bits = 0;
  uVar23 = (data->req).keepon;
  uVar19 = 0xffffffff;
  readfd0 = -1;
  if ((uVar23 & 0x15) == 1) {
    readfd0 = conn->sockfd;
  }
  if ((uVar23 & 0x2a) == 2) {
    uVar19 = (ulong)(uint)conn->writesockfd;
  }
  uVar21 = uVar21 | (conn->data->state).drain != 0;
  if (uVar21 == 0) {
    uVar21 = Curl_socket_check(readfd0,-1,(curl_socket_t)uVar19,0);
    uVar19 = extraout_RDX;
  }
  if (uVar21 == 4) {
    Curl_failf(data,"select/poll returned error");
    return CURLE_SEND_ERROR;
  }
  uVar23 = 0;
  if ((((data->req).keepon & 1) != 0) &&
     (((uVar21 & 1) != 0 || ((conn->bits).stream_was_rewound == true)))) {
    readmore = false;
    *done = false;
    uVar23 = 0;
    local_38 = 0;
    unaff_R12 = 0;
    local_40 = done;
    do {
      sVar17 = (data->set).buffer_size;
      if (sVar17 == 0) {
        sVar17 = 0x4000;
      }
      lVar12 = (data->req).size;
      if (((lVar12 != -1) && ((data->req).header == false)) &&
         (sVar13 = lVar12 - (data->req).bytecount, (long)sVar13 < (long)sVar17)) {
        sVar17 = sVar13;
      }
      if (sVar17 == 0) {
        bytes_written = 0;
LAB_0012065d:
        if ((((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) &&
           (Curl_pgrsTime(data,TIMER_STARTTRANSFER), uVar19 = extraout_RDX_01,
           (data->req).exp100 != EXP100_SEND_DATA)) {
          tVar26 = curlx_tvnow();
          uVar19 = tVar26.tv_usec;
          (data->req).start100 = tVar26;
        }
        if (bytes_written == 0) {
          uVar19 = CONCAT71((int7)(uVar19 >> 8),(data->req).bodywrites == 0);
        }
        else {
          uVar19 = 0;
        }
        if (bytes_written < 1 && (uVar19 & 1) == 0) {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
          iVar11 = 2;
          uVar23 = 1;
        }
        else {
          (data->req).buf[bytes_written] = '\0';
          (data->req).str = (data->req).buf;
          p_Var5 = conn->handler->readwrite;
          local_48 = (uint)uVar19;
          if (p_Var5 != (_func_CURLcode_SessionHandle_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)
                        0x0) {
            CVar10 = (*p_Var5)(data,conn,&bytes_written,&readmore);
            uVar23 = 1;
            uVar19 = extraout_RDX_02;
            if (CVar10 == CURLE_OK) {
              unaff_R12 = 0;
              iVar11 = 2;
              uVar19 = (ulong)local_48;
              if (readmore != false) goto LAB_0012072c;
              goto LAB_0012075f;
            }
LAB_00120709:
            uVar23 = 1;
            unaff_R12 = (ulong)CVar10;
            goto LAB_0012070c;
          }
LAB_0012075f:
          if ((data->req).header == true) {
            local_41 = false;
            CVar10 = Curl_http_readwrite_headers(data,conn,&bytes_written,&local_41);
            uVar23 = 1;
            if (CVar10 == CURLE_OK) {
              p_Var5 = conn->handler->readwrite;
              uVar19 = (ulong)local_48;
              if (((p_Var5 == (_func_CURLcode_SessionHandle_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr
                               *)0x0) || (0 < (data->req).maxdownload)) || (bytes_written < 1)) {
LAB_001208a3:
                if (local_41 == true) {
                  iVar11 = 2;
                  if (0 < bytes_written) {
                    _Var9 = Curl_pipeline_wanted(conn->data->multi,1);
                    if (_Var9) {
                      Curl_infof(data,
                                 "Rewinding stream by : %zd bytes on url %s (zero-length body)\n",
                                 bytes_written);
                      conn->read_pos = conn->read_pos - bytes_written;
                      (conn->bits).stream_was_rewound = true;
                    }
                    else {
                      Curl_infof(data,
                                 "Excess found in a non pipelined read: excess = %zd url = %s (zero-length body)\n"
                                 ,bytes_written);
                    }
                    unaff_R12 = 0;
                    goto LAB_0012079f;
                  }
                  bVar25 = false;
                }
                else {
                  iVar11 = 0;
                  bVar25 = true;
                }
                unaff_R12 = 0;
              }
              else {
                CVar10 = (*p_Var5)(data,conn,&bytes_written,&readmore);
                unaff_R12 = 0;
                if (CVar10 != CURLE_OK) goto LAB_0012079b;
                uVar19 = (ulong)local_48;
                if (readmore == false) goto LAB_001208a3;
                iVar11 = 2;
                bVar25 = false;
              }
            }
            else {
LAB_0012079b:
              unaff_R12 = (ulong)CVar10;
              iVar11 = 1;
              local_54 = CVar10;
LAB_0012079f:
              bVar25 = false;
              uVar19 = (ulong)local_48;
            }
            if (!bVar25) goto LAB_0012072c;
          }
          if ((((data->req).str != (char *)0x0) && ((data->req).header == false)) &&
             (0 < bytes_written || (uVar19 & 1) != 0)) {
            if (((data->req).bodywrites == 0 && (uVar19 & 1) == 0) &&
               ((conn->handler->protocol & 0x40003) != 0)) {
              if ((data->req).newurl == (char *)0x0) {
LAB_00120943:
                lVar12 = (data->state).resume_from;
                if (((lVar12 == 0) || ((data->req).content_range != false)) ||
                   (((data->set).httpreq != HTTPREQ_GET || ((data->req).ignorebody != false)))) {
                  if ((((data->set).timecondition == CURL_TIMECOND_NONE) ||
                      ((data->state).range != (char *)0x0)) ||
                     (_Var9 = Curl_meets_timecondition(data,(data->req).timeofdoc), _Var9))
                  goto LAB_00120998;
                  *local_40 = true;
                  (data->info).httpcode = 0x130;
                  local_54 = CURLE_OK;
                  Curl_infof(data,"Simulate a HTTP 304 response!\n");
                  (conn->bits).close = true;
                  uVar19 = extraout_RDX_09;
                }
                else if ((data->req).size == lVar12) {
                  local_54 = CURLE_OK;
                  Curl_infof(data,"The entire document is already downloaded");
                  (conn->bits).close = true;
                  piVar2 = &(data->req).keepon;
                  *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                  *local_40 = true;
                  uVar19 = extraout_RDX_10;
                }
                else {
                  Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume."
                            );
                  local_54 = CURLE_RANGE_ERROR;
                  uVar19 = extraout_RDX_11;
                }
              }
              else {
                if ((conn->bits).close != true) {
                  (data->req).ignorebody = true;
                  Curl_infof(data,"Ignoring the response-body\n");
                  goto LAB_00120943;
                }
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                *local_40 = true;
                local_54 = CURLE_OK;
              }
LAB_00120ae0:
              uVar23 = 1;
              iVar11 = 1;
              goto LAB_0012072c;
            }
LAB_00120998:
            plVar3 = &(data->req).bodywrites;
            *plVar3 = *plVar3 + 1;
            if (((data->set).verbose == true) &&
               (((data->req).badheader == HEADER_NORMAL ||
                (Curl_debug(data,CURLINFO_DATA_IN,(data->state).headerbuff,(data->req).hbuflen,conn)
                , (data->req).badheader == HEADER_PARTHEADER)))) {
              Curl_debug(data,CURLINFO_DATA_IN,(data->req).str,bytes_written,conn);
            }
            if ((data->req).chunk == true) {
              code = Curl_httpchunk_read(conn,(data->req).str,bytes_written,&bytes_written);
              if (code < CHUNKE_TOO_LONG_HEX) {
                uVar19 = extraout_RDX_03;
                if (code == CHUNKE_STOP) {
                  piVar2 = &(data->req).keepon;
                  *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                  sVar17 = (conn->chunk).dataleft;
                  if (sVar17 != 0) {
                    Curl_infof(conn->data,"Leftovers after chunking: %zu bytes\n",sVar17);
                    _Var9 = Curl_pipeline_wanted(conn->data->multi,1);
                    uVar19 = extraout_RDX_05;
                    if (_Var9) {
                      Curl_infof(conn->data,"Rewinding %zu bytes\n",sVar17);
                      conn->read_pos = conn->read_pos - sVar17;
                      (conn->bits).stream_was_rewound = true;
                      uVar19 = extraout_RDX_06;
                    }
                  }
                }
              }
              else if (code == CHUNKE_WRITE_ERROR) {
                Curl_failf(data,"Failed writing data");
                local_54 = CURLE_WRITE_ERROR;
                uVar19 = extraout_RDX_04;
              }
              else {
                pcVar15 = Curl_chunked_strerror(code);
                Curl_failf(data,"%s in chunked-encoding",pcVar15);
                local_54 = CURLE_RECV_ERROR;
                uVar19 = extraout_RDX_07;
              }
              if (CHUNKE_OK < code) goto LAB_00120ae0;
            }
            if (((data->req).badheader != HEADER_NORMAL) && ((data->req).ignorebody == false)) {
              pcVar7 = &(data->req).bytecount;
              *pcVar7 = *pcVar7 + (data->req).hbuflen;
            }
            lVar12 = (data->req).maxdownload;
            if (lVar12 != -1) {
              lVar14 = bytes_written + (data->req).bytecount;
              lVar24 = lVar14 - lVar12;
              if (lVar12 <= lVar14) {
                if ((lVar24 != 0) && ((data->req).ignorebody == false)) {
                  _Var9 = Curl_pipeline_wanted(conn->data->multi,1);
                  if (_Var9) {
                    Curl_infof(data,
                               "Rewinding stream by : %zu bytes on url %s (size = %ld, maxdownload = %ld, bytecount = %ld, nread = %zd)\n"
                               ,lVar24,(data->state).path,(data->req).size,(data->req).maxdownload,
                               (data->req).bytecount,bytes_written);
                    conn->read_pos = conn->read_pos - lVar24;
                    (conn->bits).stream_was_rewound = true;
                  }
                  else {
                    Curl_infof(data,
                               "Excess found in a non pipelined read: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld\n"
                               ,lVar24,(data->req).size,(data->req).maxdownload,
                               (data->req).bytecount);
                  }
                }
                bytes_written = (data->req).maxdownload - (data->req).bytecount;
                if (bytes_written < 1) {
                  bytes_written = 0;
                }
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                local_38 = lVar24;
              }
            }
            lVar12 = (data->req).bytecount + bytes_written;
            (data->req).bytecount = lVar12;
            Curl_pgrsSetDownloadCounter(data,lVar12);
            if ((data->req).chunk == false) {
              uVar19 = (ulong)local_48;
              if ((bytes_written != 0) ||
                 ((data->req).badheader != HEADER_NORMAL || (local_48 & 1) != 0)) {
                if (((data->req).badheader != HEADER_NORMAL) && ((data->req).ignorebody == false)) {
                  sVar17 = (data->req).maxdownload;
                  if ((sVar17 == 0xffffffffffffffff) || ((long)(data->req).hbuflen <= (long)sVar17))
                  {
                    pcVar15 = (data->state).headerbuff;
                    sVar17 = (data->req).hbuflen;
                  }
                  else {
                    pcVar15 = (data->state).headerbuff;
                  }
                  CVar10 = Curl_client_write(conn,1,pcVar15,sVar17);
                  unaff_R12 = (ulong)CVar10;
                  uVar23 = 1;
                  uVar19 = (ulong)local_48;
                  if (CVar10 != CURLE_OK) goto LAB_0012070c;
                  unaff_R12 = 0;
                }
                if (((data->req).badheader < HEADER_ALLBAD) && ((data->req).ignorebody == false)) {
                  pcVar15 = (data->req).str;
                  if ((conn->handler->protocol & 0xc000) == 0) {
                    CVar10 = Curl_client_write(conn,1,pcVar15,bytes_written);
                  }
                  else {
                    CVar10 = Curl_pop3_write(conn,pcVar15,bytes_written);
                  }
                  unaff_R12 = (ulong)CVar10;
                  uVar19 = (ulong)local_48;
                }
                (data->req).badheader = HEADER_NORMAL;
                uVar23 = 1;
                if ((int)unaff_R12 != 0) goto LAB_0012070c;
                unaff_R12 = 0;
              }
            }
            else {
              uVar19 = (ulong)local_48;
            }
          }
          p_Var5 = conn->handler->readwrite;
          if (((p_Var5 == (_func_CURLcode_SessionHandle_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)
                          0x0) || (local_38 == 0)) || ((conn->bits).stream_was_rewound != false)) {
            iVar11 = 0;
            uVar23 = 1;
            if ((char)uVar19 != '\0') {
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            }
          }
          else {
            ppcVar4 = &(data->req).str;
            *ppcVar4 = *ppcVar4 + bytes_written;
            bytes_written = local_38;
            CVar10 = (*p_Var5)(data,conn,&bytes_written,&readmore);
            uVar23 = 1;
            uVar19 = extraout_RDX_08;
            if (CVar10 != CURLE_OK) goto LAB_00120709;
            unaff_R12 = 0;
            iVar11 = 2;
            if (readmore == true) {
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 | 1;
            }
          }
        }
      }
      else {
        CVar10 = Curl_read(conn,conn->sockfd,(data->req).buf,sVar17,&bytes_written);
        unaff_R12 = (ulong)CVar10;
        uVar19 = extraout_RDX_00;
        if (CVar10 == CURLE_OK) goto LAB_0012065d;
        iVar11 = 2;
        if (CVar10 == CURLE_AGAIN) goto LAB_0012072c;
LAB_0012070c:
        iVar11 = 1;
        local_54 = (CURLcode)unaff_R12;
      }
LAB_0012072c:
      done = local_40;
      if (iVar11 != 0) {
        if (iVar11 != 2) goto LAB_00120e86;
        break;
      }
    } while ((conn->handler->protocol & 0x30) != 0);
    local_54 = CURLE_OK;
    if ((((data->req).keepon & 3U) == 2) && ((conn->bits).close == true)) {
      local_54 = CURLE_OK;
      Curl_infof(data,"we are done reading and this is set to close, stop send\n");
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
    }
LAB_00120e86:
    if (local_54 != CURLE_OK) {
      return local_54;
    }
    if (*done != false) {
      return CURLE_OK;
    }
  }
  uVar22 = uVar23;
  if ((uVar21 & (data->req).keepon & 2) == 0) goto LAB_00120f74;
  if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
  }
  uVar22 = uVar23 | 2;
  if ((data->req).upload_present == 0) {
    (data->req).upload_fromhere = (data->req).uploadbuf;
    if ((data->req).upload_done == false) {
      pvVar6 = (data->req).protop;
      if (((data->req).exp100 == EXP100_SENDING_REQUEST) && (*(int *)((long)pvVar6 + 0x78) == 2)) {
        (data->req).exp100 = EXP100_AWAITING_CONTINUE;
        piVar2 = &(data->req).keepon;
        *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
        tVar26 = curlx_tvnow();
        (data->req).start100 = tVar26;
        Curl_expire(data,(data->set).expect_100_timeout);
        cVar16 = '\x02';
        bVar25 = false;
        uVar22 = uVar23;
        CVar10 = extraout_EAX;
      }
      else {
        if ((conn->handler->protocol & 0x40003) == 0) {
          bVar25 = false;
        }
        else {
          bVar25 = *(int *)((long)pvVar6 + 0x78) == 1;
        }
        CVar10 = Curl_fillreadbuffer(conn,0x4000,(int *)&bytes_written);
        if (CVar10 == CURLE_OK) {
          unaff_R12 = (ulong)(int)bytes_written;
        }
        cVar16 = CVar10 != CURLE_OK;
      }
      if (cVar16 != '\x02') {
        if (cVar16 == '\0') goto LAB_00121169;
        goto LAB_00120f67;
      }
      goto LAB_00120f65;
    }
    unaff_R12 = 0;
    bVar25 = false;
LAB_00121169:
    if ((unaff_R12 == 0) && (((data->req).keepon & 0x20) != 0)) goto LAB_00120f65;
    if ((long)unaff_R12 < 1) {
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
      if (((conn->bits).rewindaftersend != true) ||
         (CVar10 = Curl_readrewind(conn), CVar10 == CURLE_OK)) goto LAB_00120f65;
    }
    else {
      (data->req).upload_present = unaff_R12;
      if ((!bVar25) && (((data->set).prefer_ascii != false || ((data->set).crlf == true)))) {
        if ((data->state).scratch == (char *)0x0) {
          pcVar15 = (char *)(*Curl_cmalloc)(0x8000);
          (data->state).scratch = pcVar15;
          if (pcVar15 == (char *)0x0) {
            Curl_failf(data,"Failed to alloc scratch buffer!");
            CVar10 = CURLE_OUT_OF_MEMORY;
            goto LAB_00120f67;
          }
        }
        uVar19 = 1;
        if (1 < (long)unaff_R12) {
          uVar19 = unaff_R12;
        }
        uVar18 = 0;
        uVar20 = 0;
        do {
          cVar16 = (data->req).upload_fromhere[uVar18];
          pcVar15 = (data->state).scratch;
          if (cVar16 == '\n') {
            uVar1 = uVar20 + 1;
            pcVar15[uVar20] = '\r';
            (data->state).scratch[uVar20 + 1] = '\n';
            uVar20 = uVar1;
            if ((data->set).crlf == false) {
              pcVar7 = &(data->state).infilesize;
              *pcVar7 = *pcVar7 + 1;
            }
          }
          else {
            pcVar15[uVar20] = cVar16;
          }
          uVar18 = uVar18 + 1;
          uVar20 = uVar20 + 1;
        } while (uVar19 != uVar18);
        if (uVar20 != unaff_R12) {
          (data->req).upload_fromhere = (data->state).scratch;
          (data->req).upload_present = uVar20;
          unaff_R12 = uVar20;
        }
      }
      if (((conn->handler->protocol & 0x30000) == 0) ||
         (CVar10 = Curl_smtp_escape_eob(conn,unaff_R12), CVar10 == CURLE_OK)) goto LAB_001204e5;
    }
  }
  else {
LAB_001204e5:
    CVar10 = Curl_write(conn,conn->writesockfd,(data->req).upload_fromhere,
                        (data->req).upload_present,&bytes_written);
    if (CVar10 != CURLE_OK) goto LAB_00120f67;
    if ((data->set).verbose == true) {
      Curl_debug(data,CURLINFO_DATA_OUT,(data->req).upload_fromhere,bytes_written,conn);
    }
    lVar12 = (data->req).writebytecount + bytes_written;
    (data->req).writebytecount = lVar12;
    if (lVar12 == (data->state).infilesize) {
      (data->req).upload_done = true;
      Curl_infof(data,"We are completely uploaded and fine\n");
    }
    lVar12 = (data->req).upload_present - bytes_written;
    if (lVar12 == 0) {
      (data->req).upload_fromhere = (data->req).uploadbuf;
      (data->req).upload_present = 0;
      if ((data->req).upload_done == true) {
        piVar2 = &(data->req).keepon;
        *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
      }
    }
    else {
      (data->req).upload_present = lVar12;
      ppcVar4 = &(data->req).upload_fromhere;
      *ppcVar4 = *ppcVar4 + bytes_written;
    }
    Curl_pgrsSetUploadCounter(data,(data->req).writebytecount);
LAB_00120f65:
    CVar10 = CURLE_OK;
  }
LAB_00120f67:
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
LAB_00120f74:
  tVar26 = curlx_tvnow();
  (data->req).now = tVar26;
  if (uVar22 == 0) {
    if (((data->req).exp100 == EXP100_AWAITING_CONTINUE) &&
       (lVar12 = curlx_tvdiff(tVar26,(data->req).start100), (data->set).expect_100_timeout <= lVar12
       )) {
      (data->req).exp100 = EXP100_SEND_DATA;
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 2;
      Curl_infof(data,"Done waiting for 100-continue\n");
    }
  }
  else {
    pcVar7 = (data->req).bytecountp;
    if (pcVar7 != (curl_off_t *)0x0) {
      *pcVar7 = (data->req).bytecount;
    }
    pcVar7 = (data->req).writebytecountp;
    if (pcVar7 != (curl_off_t *)0x0) {
      *pcVar7 = (data->req).writebytecount;
    }
  }
  iVar11 = Curl_pgrsUpdate(conn);
  CVar10 = CURLE_ABORTED_BY_CALLBACK;
  if (iVar11 == 0) {
    CVar10 = Curl_speedcheck(data,(data->req).now);
  }
  if (CVar10 == CURLE_OK) {
    if ((data->req).keepon == 0) {
      if ((data->set).opt_no_body == false) {
        lVar12 = (data->req).size;
        if ((((lVar12 != -1) && (lVar14 = (data->req).bytecount, lVar12 != lVar14)) &&
            (lVar14 != lVar12 + (data->state).crlf_conversions)) &&
           ((data->req).newurl == (char *)0x0)) {
          Curl_failf(data,"transfer closed with %ld bytes remaining to read");
          return CURLE_PARTIAL_FILE;
        }
        if (((data->req).chunk == true) && ((conn->chunk).state != CHUNK_STOP)) {
          Curl_failf(data,"transfer closed with outstanding read data remaining");
          return CURLE_PARTIAL_FILE;
        }
      }
      iVar11 = Curl_pgrsUpdate(conn);
      if (iVar11 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    else {
      lVar12 = Curl_timeleft(data,&(data->req).now,false);
      if (lVar12 < 0) {
        lVar12 = (data->req).size;
        lVar14 = curlx_tvdiff((data->req).now,(data->progress).t_startsingle);
        cVar8 = (data->req).bytecount;
        if (lVar12 == -1) {
          Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",
                     lVar14,cVar8);
        }
        else {
          Curl_failf(data,
                     "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                     ,lVar14,cVar8,(data->req).size);
        }
        return CURLE_OPERATION_TIMEDOUT;
      }
    }
    *done = ((data->req).keepon & 0x33) == 0;
    return CURLE_OK;
  }
  return CVar10;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        struct SessionHandle *data,
                        bool *done)
{
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat=0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(conn->data->state.drain) {
    select_res |= CURL_CSELECT_IN;
    DEBUGF(infof(data, "Curl_readwrite: forcibly told to drain data\n"));
  }

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_ready(fd_read, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, k, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_tvnow();
  if(didwhat) {
    /* Update read/write counters */
    if(k->bytecountp)
      *k->bytecountp = k->bytecount; /* read count */
    if(k->writebytecountp)
      *k->writebytecountp = k->writebytecount; /* write count */
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      long ms = Curl_tvdiff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount,
              k->size);
      }
      else {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !data->req.newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read",
            k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    else if(!(data->set.opt_no_body) &&
            k->chunk &&
            (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}